

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestAllTypesLite::clear_oneof_field(TestAllTypesLite *this)

{
  long *plVar1;
  OneofFieldCase OVar2;
  Arena *pAVar3;
  TestAllTypesLite *this_local;
  
  OVar2 = oneof_field_case(this);
  if ((OVar2 != ONEOF_FIELD_NOT_SET) && (OVar2 != kOneofUint32)) {
    if (OVar2 == kOneofNestedMessage) {
      pAVar3 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
      if (pAVar3 == (Arena *)0x0) {
        plVar1 = *(long **)((long)&this->field_0 + 0x328);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
      }
      else if ((this->field_0)._impl_.oneof_field_.oneof_nested_message_ != (MessageLite *)0x0) {
        (**(code **)(**(long **)((long)&this->field_0 + 0x328) + 0x10))();
      }
    }
    else if (OVar2 == kOneofString) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
    else if (OVar2 == kOneofBytes) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
    else if (OVar2 == kOneofLazyNestedMessage) {
      pAVar3 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
      if (pAVar3 == (Arena *)0x0) {
        plVar1 = *(long **)((long)&this->field_0 + 0x328);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
      }
      else if ((this->field_0)._impl_.oneof_field_.oneof_nested_message_ != (MessageLite *)0x0) {
        (**(code **)(**(long **)((long)&this->field_0 + 0x328) + 0x10))();
      }
    }
    else if (OVar2 == kOneofNestedMessage2) {
      pAVar3 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
      if (pAVar3 == (Arena *)0x0) {
        plVar1 = *(long **)((long)&this->field_0 + 0x328);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
      }
      else if ((this->field_0)._impl_.oneof_field_.oneof_nested_message_ != (MessageLite *)0x0) {
        (**(code **)(**(long **)((long)&this->field_0 + 0x328) + 0x10))();
      }
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestAllTypesLite::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestAllTypesLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofUint32: {
      // No need to clear
      break;
    }
    case kOneofNestedMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_nested_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_nested_message_ != nullptr) {
          _impl_.oneof_field_.oneof_nested_message_->Clear();
        }
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case kOneofLazyNestedMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_lazy_nested_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_lazy_nested_message_ != nullptr) {
          _impl_.oneof_field_.oneof_lazy_nested_message_->Clear();
        }
      }
      break;
    }
    case kOneofNestedMessage2: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_nested_message2_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_nested_message2_ != nullptr) {
          _impl_.oneof_field_.oneof_nested_message2_->Clear();
        }
      }
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}